

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Plan::NodeFinished(Plan *this,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  Edge *pEVar2;
  bool bVar3;
  pointer ppEVar4;
  _Base_ptr p_Var5;
  iterator want_e;
  pointer ppEVar6;
  
  if (node->dyndep_pending_ == true) {
    if (this->builder_ == (Builder *)0x0) {
      __assert_fail("builder_ && \"dyndep requires Plan to have a Builder\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                    ,0x1bb,"bool Plan::NodeFinished(Node *, string *)");
    }
    bVar3 = Builder::LoadDyndeps(this->builder_,node,err);
    return bVar3;
  }
  ppEVar6 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar4 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar6 != ppEVar4) {
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var5 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var5 != (_Base_ptr)0x0) {
        pEVar2 = *ppEVar6;
        want_e._M_node = &p_Var1->_M_header;
        do {
          if (*(Edge **)(p_Var5 + 1) >= pEVar2) {
            want_e._M_node = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(Edge **)(p_Var5 + 1) < pEVar2];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)want_e._M_node != p_Var1) &&
           (*(Edge **)(want_e._M_node + 1) <= pEVar2)) {
          bVar3 = EdgeMaybeReady(this,want_e,err);
          if (!bVar3) {
            return false;
          }
          ppEVar4 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      ppEVar6 = ppEVar6 + 1;
    } while (ppEVar6 != ppEVar4);
  }
  return true;
}

Assistant:

bool Plan::NodeFinished(Node* node, string* err) {
  // If this node provides dyndep info, load it now.
  if (node->dyndep_pending()) {
    assert(builder_ && "dyndep requires Plan to have a Builder");
    // Load the now-clean dyndep file.  This will also update the
    // build plan and schedule any new work that is ready.
    return builder_->LoadDyndeps(node, err);
  }

  // See if we we want any edges from this node.
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;

    // See if the edge is now ready.
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }
  return true;
}